

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSubmitCommand.cxx
# Opt level: O1

bool __thiscall cmCTestSubmitCommand::CheckArgumentKeyword(cmCTestSubmitCommand *this,string *arg)

{
  bool bVar1;
  int iVar2;
  
  if (this->CDashUpload == true) {
    iVar2 = std::__cxx11::string::compare((char *)arg);
    if (iVar2 == 0) {
      (this->super_cmCTestHandlerCommand).ArgumentDoing = 7;
      return true;
    }
    iVar2 = std::__cxx11::string::compare((char *)arg);
    if (iVar2 == 0) {
      (this->super_cmCTestHandlerCommand).ArgumentDoing = 8;
      return true;
    }
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)arg);
    if (iVar2 == 0) {
      (this->super_cmCTestHandlerCommand).ArgumentDoing = 3;
      this->PartsMentioned = true;
      return true;
    }
    iVar2 = std::__cxx11::string::compare((char *)arg);
    if (iVar2 == 0) {
      (this->super_cmCTestHandlerCommand).ArgumentDoing = 4;
      this->FilesMentioned = true;
      return true;
    }
  }
  iVar2 = std::__cxx11::string::compare((char *)arg);
  if (iVar2 == 0) {
    (this->super_cmCTestHandlerCommand).ArgumentDoing = 9;
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)arg);
    if (iVar2 == 0) {
      (this->super_cmCTestHandlerCommand).ArgumentDoing = 6;
    }
    else {
      iVar2 = std::__cxx11::string::compare((char *)arg);
      if (iVar2 == 0) {
        (this->super_cmCTestHandlerCommand).ArgumentDoing = 5;
      }
      else {
        iVar2 = std::__cxx11::string::compare((char *)arg);
        if (iVar2 == 0) {
          (this->super_cmCTestHandlerCommand).ArgumentDoing = 10;
        }
        else {
          iVar2 = std::__cxx11::string::compare((char *)arg);
          if (iVar2 != 0) {
            bVar1 = cmCTestHandlerCommand::CheckArgumentKeyword
                              (&this->super_cmCTestHandlerCommand,arg);
            return bVar1;
          }
          this->InternalTest = true;
        }
      }
    }
  }
  return true;
}

Assistant:

bool cmCTestSubmitCommand::CheckArgumentKeyword(std::string const& arg)
{
  if (this->CDashUpload) {
    // Arguments specific to the CDASH_UPLOAD signature.
    if (arg == "CDASH_UPLOAD") {
      this->ArgumentDoing = ArgumentDoingCDashUpload;
      return true;
    }

    if (arg == "CDASH_UPLOAD_TYPE") {
      this->ArgumentDoing = ArgumentDoingCDashUploadType;
      return true;
    }
  } else {
    // Arguments that cannot be used with CDASH_UPLOAD.
    if (arg == "PARTS") {
      this->ArgumentDoing = ArgumentDoingParts;
      this->PartsMentioned = true;
      return true;
    }

    if (arg == "FILES") {
      this->ArgumentDoing = ArgumentDoingFiles;
      this->FilesMentioned = true;
      return true;
    }
  }
  // Arguments used by both modes.
  if (arg == "HTTPHEADER") {
    this->ArgumentDoing = ArgumentDoingHttpHeader;
    return true;
  }

  if (arg == "RETRY_COUNT") {
    this->ArgumentDoing = ArgumentDoingRetryCount;
    return true;
  }

  if (arg == "RETRY_DELAY") {
    this->ArgumentDoing = ArgumentDoingRetryDelay;
    return true;
  }

  if (arg == "SUBMIT_URL") {
    this->ArgumentDoing = ArgumentDoingSubmitURL;
    return true;
  }

  if (arg == "INTERNAL_TEST_CHECKSUM") {
    this->InternalTest = true;
    return true;
  }

  // Look for other arguments.
  return this->Superclass::CheckArgumentKeyword(arg);
}